

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-xform.cc
# Opt level: O0

void xformOp_test(void)

{
  double *this;
  XformOp *pXVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  ostream *poVar5;
  bool ret_5;
  TimeSampleInterpolationType tinterp_5;
  double t_5;
  string err_5;
  undefined1 auStack_d58 [7];
  bool resetXformStack_5;
  matrix4d m_5;
  XformOp op_6;
  XformOp op_5;
  Xformable x_5;
  double3 scale_1;
  undefined1 auStack_b38 [8];
  double3 trans;
  double eps_1;
  bool ret_4;
  TimeSampleInterpolationType tinterp_4;
  double t_4;
  string err_4;
  undefined1 auStack_ad8 [7];
  bool resetXformStack_4;
  matrix4d m_4;
  Xformable x_4;
  XformOp op_4;
  double3 rotXYZ_3;
  double eps;
  bool ret_3;
  TimeSampleInterpolationType tinterp_3;
  double t_3;
  string err_3;
  undefined1 auStack_8e8 [7];
  bool resetXformStack_3;
  matrix4d m_3;
  Xformable x_3;
  XformOp op_3;
  double3 rotXYZ_2;
  bool ret_2;
  TimeSampleInterpolationType tinterp_2;
  double t_2;
  string err_2;
  undefined1 auStack_708 [7];
  bool resetXformStack_2;
  matrix4d m_2;
  Xformable x_2;
  XformOp op_2;
  double3 rotXYZ_1;
  bool ret_1;
  TimeSampleInterpolationType tinterp_1;
  double t_1;
  string err_1;
  undefined1 auStack_528 [7];
  bool resetXformStack_1;
  matrix4d m_1;
  Xformable x_1;
  XformOp op_1;
  double3 rotXYZ;
  matrix4d c;
  matrix4d b;
  matrix4d a;
  bool ret;
  TimeSampleInterpolationType tinterp;
  double t;
  string err;
  undefined1 auStack_1c8 [7];
  bool resetXformStack;
  matrix4d m;
  Xformable x;
  undefined1 local_98 [8];
  XformOp op;
  double3 scale;
  
  op._is_blocked = false;
  op._105_7_ = 0x3ff00000000000;
  tinyusdz::XformOp::XformOp((XformOp *)local_98);
  local_98._0_4_ = Scale;
  local_98[4] = true;
  tinyusdz::XformOp::set_value<std::array<double,3ul>>
            ((XformOp *)local_98,(array<double,_3UL> *)&op._is_blocked);
  tinyusdz::Xformable::Xformable((Xformable *)(m.m[3] + 3));
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(m.m[3] + 3),
             (value_type *)local_98);
  tinyusdz::value::matrix4d::matrix4d((matrix4d *)auStack_1c8);
  std::__cxx11::string::string((string *)&t);
  dVar2 = tinyusdz::value::TimeCode::Default();
  bVar4 = tinyusdz::Xformable::EvaluateXformOps
                    ((Xformable *)(m.m[3] + 3),dVar2,Held,(matrix4d *)auStack_1c8,
                     (bool *)(err.field_2._M_local_buf + 0xf),(string *)&t);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x2a,"%s","ret == true");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(_auStack_1c8,1.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x2c,"%s","float_equals(m.m[0][0], 1.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m.m[1][0],0.5,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x2d,"%s","float_equals(m.m[1][1], 1.0/2.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m.m[2][1],0.3333333333333333,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x2e,"%s","float_equals(m.m[2][2], 1.0/3.0)");
  std::__cxx11::string::~string((string *)&t);
  tinyusdz::Xformable::~Xformable((Xformable *)(m.m[3] + 3));
  tinyusdz::XformOp::~XformOp((XformOp *)local_98);
  this = b.m[3] + 3;
  tinyusdz::value::matrix4d::matrix4d((matrix4d *)this);
  b.m[3][3] = 0.0;
  tinyusdz::value::matrix4d::identity();
  b.m[3][1] = -30.0;
  tinyusdz::value::operator*
            ((matrix4d *)(rotXYZ._M_elems + 2),(matrix4d *)this,(matrix4d *)(c.m[3] + 3));
  poVar5 = std::operator<<((ostream *)&std::cout,(matrix4d *)(rotXYZ._M_elems + 2));
  std::operator<<(poVar5,"\n");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(rotXYZ._M_elems[2],0.0,dVar2);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x4d,"%s","float_equals(c.m[0][0], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(c.m[0][0],0.0,dVar2);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x4e,"%s","float_equals(c.m[0][1], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(c.m[0][1],1.0,dVar2);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x4f,"%s","float_equals(c.m[0][2], 1.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(c.m[0][2],0.0,dVar2);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x50,"%s","float_equals(c.m[0][3], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(c.m[0][3],0.0,dVar2);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x52,"%s","float_equals(c.m[1][0], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(c.m[1][0],1.0,dVar2);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x53,"%s","float_equals(c.m[1][1], 1.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(c.m[1][1],0.0,dVar2);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x54,"%s","float_equals(c.m[1][2], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(c.m[1][2],0.0,dVar2);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x55,"%s","float_equals(c.m[1][3], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(c.m[1][3],-1.0,dVar2);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x57,"%s","float_equals(c.m[2][0], -1.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(c.m[2][0],0.0,dVar2);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x58,"%s","float_equals(c.m[2][1], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(c.m[2][1],0.0,dVar2);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x59,"%s","float_equals(c.m[2][2], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(c.m[2][2],0.0,dVar2);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x5a,"%s","float_equals(c.m[2][3], 0.0)");
  bVar4 = tinyusdz_test::float_equals<double>(c.m[2][3],0.442,1e-05);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x5c,"%s","float_equals(c.m[3][0], 0.442, 0.00001)");
  bVar4 = tinyusdz_test::float_equals<double>(c.m[3][0],-7.532,1e-05);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x5d,"%s","float_equals(c.m[3][1], -7.532, 0.00001)");
  bVar4 = tinyusdz_test::float_equals<double>(c.m[3][1],-11.389,1e-05);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x5e,"%s","float_equals(c.m[3][2], -11.389, 0.00001)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(c.m[3][2],1.0,dVar2);
  acutest_check_((uint)bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x5f,"%s","float_equals(c.m[3][3], 1.0)");
  op_1._is_blocked = false;
  op_1._105_7_ = 0x40568000000000;
  rotXYZ._M_elems[0] = 0.0;
  rotXYZ._M_elems[1] = 0.0;
  pXVar1 = (XformOp *)(x_1._matrix.m[3] + 3);
  tinyusdz::XformOp::XformOp(pXVar1);
  x_1._matrix.m[3][3]._0_4_ = 6;
  x_1._matrix.m[3][3]._4_1_ = 0;
  tinyusdz::XformOp::set_value<std::array<double,3ul>>
            (pXVar1,(array<double,_3UL> *)&op_1._is_blocked);
  tinyusdz::Xformable::Xformable((Xformable *)(m_1.m[3] + 3));
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(m_1.m[3] + 3),
             (value_type *)(x_1._matrix.m[3] + 3));
  tinyusdz::value::matrix4d::matrix4d((matrix4d *)auStack_528);
  std::__cxx11::string::string((string *)&t_1);
  dVar2 = tinyusdz::value::TimeCode::Default();
  bVar4 = tinyusdz::Xformable::EvaluateXformOps
                    ((Xformable *)(m_1.m[3] + 3),dVar2,Held,(matrix4d *)auStack_528,
                     (bool *)(err_1.field_2._M_local_buf + 0xf),(string *)&t_1);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x78,"%s","ret");
  poVar5 = std::operator<<((ostream *)&std::cout,"rotXYZ = ");
  poVar5 = std::operator<<(poVar5,(matrix4d *)auStack_528);
  std::operator<<(poVar5,"\n");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(_auStack_528,1.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x7f,"%s","float_equals(m.m[0][0], 1.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[0][0],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x80,"%s","float_equals(m.m[0][1], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[0][1],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x81,"%s","float_equals(m.m[0][2], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[0][2],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x82,"%s","float_equals(m.m[0][3], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[0][3],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x84,"%s","float_equals(m.m[1][0], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[1][0],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x85,"%s","float_equals(m.m[1][1], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[1][1],1.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x86,"%s","float_equals(m.m[1][2], 1.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[1][2],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x87,"%s","float_equals(m.m[1][3], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[1][3],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x89,"%s","float_equals(m.m[2][0], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[2][0],-1.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x8a,"%s","float_equals(m.m[2][1], -1.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[2][1],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x8b,"%s","float_equals(m.m[2][2], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[2][2],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x8c,"%s","float_equals(m.m[2][3], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[2][3],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x8e,"%s","float_equals(m.m[3][0], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[3][0],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x8f,"%s","float_equals(m.m[3][1], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[3][1],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x90,"%s","float_equals(m.m[3][2], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_1.m[3][2],1.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x91,"%s","float_equals(m.m[3][3], 1.0)");
  std::__cxx11::string::~string((string *)&t_1);
  tinyusdz::Xformable::~Xformable((Xformable *)(m_1.m[3] + 3));
  tinyusdz::XformOp::~XformOp((XformOp *)(x_1._matrix.m[3] + 3));
  op_2._is_blocked = false;
  op_2._105_7_ = 0;
  pXVar1 = (XformOp *)(x_2._matrix.m[3] + 3);
  tinyusdz::XformOp::XformOp(pXVar1);
  x_2._matrix.m[3][3]._0_4_ = 6;
  x_2._matrix.m[3][3]._4_1_ = 0;
  tinyusdz::XformOp::set_value<std::array<double,3ul>>
            (pXVar1,(array<double,_3UL> *)&op_2._is_blocked);
  tinyusdz::Xformable::Xformable((Xformable *)(m_2.m[3] + 3));
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(m_2.m[3] + 3),
             (value_type *)(x_2._matrix.m[3] + 3));
  tinyusdz::value::matrix4d::matrix4d((matrix4d *)auStack_708);
  std::__cxx11::string::string((string *)&t_2);
  dVar2 = tinyusdz::value::TimeCode::Default();
  bVar4 = tinyusdz::Xformable::EvaluateXformOps
                    ((Xformable *)(m_2.m[3] + 3),dVar2,Held,(matrix4d *)auStack_708,
                     (bool *)(err_2.field_2._M_local_buf + 0xf),(string *)&t_2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xab,"%s","ret");
  poVar5 = std::operator<<((ostream *)&std::cout,"rotXYZ = ");
  poVar5 = std::operator<<(poVar5,(matrix4d *)auStack_708);
  std::operator<<(poVar5,"\n");
  bVar4 = tinyusdz_test::float_equals<double>(_auStack_708,0.4120283041870241,1e-05);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xb3,"%s","float_equals(m.m[0][0], 0.4120283041870241, 0.00001)");
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[0][0],-0.9111710468121587,1e-05);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xb4,"%s","float_equals(m.m[0][1], -0.9111710468121587, 0.00001)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[0][1],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xb5,"%s","float_equals(m.m[0][2], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[0][2],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xb6,"%s","float_equals(m.m[0][3], 0.0)");
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[0][3],0.9111710468121587,1e-05);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xb8,"%s","float_equals(m.m[1][0], 0.9111710468121587, 0.00001)");
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[1][0],0.4120283041870241,1e-05);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xb9,"%s","float_equals(m.m[1][1], 0.4120283041870241, 0.00001)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[1][1],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xba,"%s","float_equals(m.m[1][2], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[1][2],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xbb,"%s","float_equals(m.m[1][3], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[1][3],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xbd,"%s","float_equals(m.m[2][0], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[2][0],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xbe,"%s","float_equals(m.m[2][1], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[2][1],1.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xbf,"%s","float_equals(m.m[2][2], 1.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[2][2],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xc0,"%s","float_equals(m.m[2][3], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[2][3],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xc2,"%s","float_equals(m.m[3][0], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[3][0],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xc3,"%s","float_equals(m.m[3][1], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[3][1],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xc4,"%s","float_equals(m.m[3][2], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_2.m[3][2],1.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xc5,"%s","float_equals(m.m[3][3], 1.0)");
  std::__cxx11::string::~string((string *)&t_2);
  tinyusdz::Xformable::~Xformable((Xformable *)(m_2.m[3] + 3));
  tinyusdz::XformOp::~XformOp((XformOp *)(x_2._matrix.m[3] + 3));
  op_3._is_blocked = false;
  op_3._105_7_ = 0x40240000000000;
  pXVar1 = (XformOp *)(x_3._matrix.m[3] + 3);
  tinyusdz::XformOp::XformOp(pXVar1);
  x_3._matrix.m[3][3]._0_4_ = 6;
  x_3._matrix.m[3][3]._4_1_ = 0;
  tinyusdz::XformOp::set_value<std::array<double,3ul>>
            (pXVar1,(array<double,_3UL> *)&op_3._is_blocked);
  tinyusdz::Xformable::Xformable((Xformable *)(m_3.m[3] + 3));
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(m_3.m[3] + 3),
             (value_type *)(x_3._matrix.m[3] + 3));
  tinyusdz::value::matrix4d::matrix4d((matrix4d *)auStack_8e8);
  std::__cxx11::string::string((string *)&t_3);
  dVar2 = tinyusdz::value::TimeCode::Default();
  bVar4 = tinyusdz::Xformable::EvaluateXformOps
                    ((Xformable *)(m_3.m[3] + 3),dVar2,Held,(matrix4d *)auStack_8e8,
                     (bool *)(err_3.field_2._M_local_buf + 0xf),(string *)&t_3);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xdc,"%s","ret");
  poVar5 = std::operator<<((ostream *)&std::cout,"rotXYZ = ");
  poVar5 = std::operator<<(poVar5,(matrix4d *)auStack_8e8);
  std::operator<<(poVar5,"\n");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(_auStack_8e8,0.6710191595559729,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xe4,"%s","float_equals(m.m[0][0], 0.6710191595559729, eps)");
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[0][0],0.6301289334241799,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xe5,"%s","float_equals(m.m[0][1], 0.6301289334241799, eps)");
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[0][1],-0.39073112848927377,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xe6,"%s","float_equals(m.m[0][2], -0.39073112848927377, eps)");
  dVar3 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[0][2],0.0,dVar3);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xe7,"%s","float_equals(m.m[0][3], 0.0)");
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[0][3],-0.6246869592440953,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xe9,"%s","float_equals(m.m[1][0], -0.6246869592440953, eps)");
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[1][0],0.7643403049061097,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xea,"%s","float_equals(m.m[1][1], 0.7643403049061097, eps)");
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[1][1],0.15984399033558103,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xeb,"%s","float_equals(m.m[1][2], 0.15984399033558103, eps)");
  dVar3 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[1][2],0.0,dVar3);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xec,"%s","float_equals(m.m[1][3], 0.0)");
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[1][3],0.3993738730302244,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xee,"%s","float_equals(m.m[2][0], 0.3993738730302244, eps)");
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[2][0],0.13682626048292368,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xef,"%s","float_equals(m.m[2][1], 0.13682626048292368, eps)");
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[2][1],0.9065203163653295,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xf0,"%s","float_equals(m.m[2][2], 0.9065203163653295, eps)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[2][2],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xf1,"%s","float_equals(m.m[2][3], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[2][3],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xf3,"%s","float_equals(m.m[3][0], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[3][0],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xf4,"%s","float_equals(m.m[3][1], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[3][1],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xf5,"%s","float_equals(m.m[3][2], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_3.m[3][2],1.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xf6,"%s","float_equals(m.m[3][3], 1.0)");
  std::__cxx11::string::~string((string *)&t_3);
  tinyusdz::Xformable::~Xformable((Xformable *)(m_3.m[3] + 3));
  tinyusdz::XformOp::~XformOp((XformOp *)(x_3._matrix.m[3] + 3));
  op_4._is_blocked = false;
  op_4._105_7_ = 0xc0240000000000;
  pXVar1 = (XformOp *)(x_4._matrix.m[3] + 3);
  tinyusdz::XformOp::XformOp(pXVar1);
  x_4._matrix.m[3][3]._0_4_ = 6;
  x_4._matrix.m[3][3]._4_1_ = 1;
  tinyusdz::XformOp::set_value<std::array<double,3ul>>
            (pXVar1,(array<double,_3UL> *)&op_4._is_blocked);
  tinyusdz::Xformable::Xformable((Xformable *)(m_4.m[3] + 3));
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(m_4.m[3] + 3),
             (value_type *)(x_4._matrix.m[3] + 3));
  tinyusdz::value::matrix4d::matrix4d((matrix4d *)auStack_ad8);
  std::__cxx11::string::string((string *)&t_4);
  dVar2 = tinyusdz::value::TimeCode::Default();
  bVar4 = tinyusdz::Xformable::EvaluateXformOps
                    ((Xformable *)(m_4.m[3] + 3),dVar2,Held,(matrix4d *)auStack_ad8,
                     (bool *)(err_4.field_2._M_local_buf + 0xf),(string *)&t_4);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x10d,"%s","ret");
  poVar5 = std::operator<<((ostream *)&std::cout,"rotXYZ = ");
  poVar5 = std::operator<<(poVar5,(matrix4d *)auStack_ad8);
  std::operator<<(poVar5,"\n");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(_auStack_ad8,0.7102852087270047,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x114,"%s","float_equals(m.m[0][0], 0.7102852087270047, eps)");
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[0][0],-0.7026225180689177,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x115,"%s","float_equals(m.m[0][1], -0.7026225180689177, eps)");
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[0][1],0.0426206448347375,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x116,"%s","float_equals(m.m[0][2], 0.0426206448347375, eps)");
  dVar3 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[0][2],0.0,dVar3);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x117,"%s","float_equals(m.m[0][3], 0.0)");
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[0][3],0.6670022079522818,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x119,"%s","float_equals(m.m[1][0], 0.6670022079522818, eps)");
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[1][0],0.6911539437437854,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x11a,"%s","float_equals(m.m[1][1], 0.6911539437437854, eps)");
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[1][1],0.2782342190209419,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x11b,"%s","float_equals(m.m[1][2], 0.2782342190209419, eps)");
  dVar3 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[1][2],0.0,dVar3);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x11c,"%s","float_equals(m.m[1][3], 0.0)");
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[1][3],-0.224951054343865,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x11e,"%s","float_equals(m.m[2][0], -0.224951054343865, eps)");
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[2][0],-0.16919758612316493,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x11f,"%s","float_equals(m.m[2][1], -0.16919758612316493, eps)");
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[2][1],0.9595671941035071,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x120,"%s","float_equals(m.m[2][2], 0.9595671941035071, eps)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[2][2],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x121,"%s","float_equals(m.m[2][3], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[2][3],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x123,"%s","float_equals(m.m[3][0], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[3][0],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x124,"%s","float_equals(m.m[3][1], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[3][1],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x125,"%s","float_equals(m.m[3][2], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_4.m[3][2],1.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x126,"%s","float_equals(m.m[3][3], 1.0)");
  std::__cxx11::string::~string((string *)&t_4);
  tinyusdz::Xformable::~Xformable((Xformable *)(m_4.m[3] + 3));
  tinyusdz::XformOp::~XformOp((XformOp *)(x_4._matrix.m[3] + 3));
  trans._M_elems[1] = 1.0;
  auStack_b38 = (undefined1  [8])0x3ff0000000000000;
  trans._M_elems[0] = 1.0;
  x_5._matrix.m[3][3] = 1.5;
  tinyusdz::Xformable::Xformable((Xformable *)&op_5._is_blocked);
  tinyusdz::XformOp::XformOp((XformOp *)&op_6._is_blocked);
  op_6._is_blocked = true;
  op_6._105_3_ = 0;
  op_6._108_1_ = 0;
  tinyusdz::XformOp::set_value<std::array<double,3ul>>
            ((XformOp *)&op_6._is_blocked,(array<double,_3UL> *)auStack_b38);
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)&op_5._is_blocked,
             (value_type *)&op_6._is_blocked);
  tinyusdz::XformOp::~XformOp((XformOp *)&op_6._is_blocked);
  tinyusdz::XformOp::XformOp((XformOp *)(m_5.m[3] + 3));
  m_5.m[3][3]._0_4_ = 2;
  m_5.m[3][3]._4_1_ = 0;
  tinyusdz::XformOp::set_value<std::array<double,3ul>>
            ((XformOp *)(m_5.m[3] + 3),(array<double,_3UL> *)(x_5._matrix.m[3] + 3));
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)&op_5._is_blocked,
             (value_type *)(m_5.m[3] + 3));
  tinyusdz::XformOp::~XformOp((XformOp *)(m_5.m[3] + 3));
  tinyusdz::value::matrix4d::matrix4d((matrix4d *)auStack_d58);
  std::__cxx11::string::string((string *)&t_5);
  dVar2 = tinyusdz::value::TimeCode::Default();
  bVar4 = tinyusdz::Xformable::EvaluateXformOps
                    ((Xformable *)&op_5._is_blocked,dVar2,Held,(matrix4d *)auStack_d58,
                     (bool *)(err_5.field_2._M_local_buf + 0xf),(string *)&t_5);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x14a,"%s","ret");
  poVar5 = std::operator<<((ostream *)&std::cout,"trans x scale = ");
  poVar5 = std::operator<<(poVar5,(matrix4d *)auStack_d58);
  std::operator<<(poVar5,"\n");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(_auStack_d58,1.5,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x14f,"%s","float_equals(m.m[0][0], 1.5)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[0][0],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x150,"%s","float_equals(m.m[0][1], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[0][1],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x151,"%s","float_equals(m.m[0][2], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[0][2],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x152,"%s","float_equals(m.m[0][3], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[0][3],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x154,"%s","float_equals(m.m[1][0], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[1][0],0.5,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x155,"%s","float_equals(m.m[1][1], 0.5)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[1][1],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x156,"%s","float_equals(m.m[1][2], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[1][2],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x157,"%s","float_equals(m.m[1][3], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[1][3],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x159,"%s","float_equals(m.m[2][0], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[2][0],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x15a,"%s","float_equals(m.m[2][1], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[2][1],2.5,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x15b,"%s","float_equals(m.m[2][2], 2.5)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[2][2],0.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x15c,"%s","float_equals(m.m[2][3], 0.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[2][3],1.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x15e,"%s","float_equals(m.m[3][0], 1.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[3][0],1.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x15f,"%s","float_equals(m.m[3][1], 1.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[3][1],1.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x160,"%s","float_equals(m.m[3][2], 1.0)");
  dVar2 = std::numeric_limits<double>::epsilon();
  bVar4 = tinyusdz_test::float_equals<double>(m_5.m[3][2],1.0,dVar2);
  acutest_check_(bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x161,"%s","float_equals(m.m[3][3], 1.0)");
  std::__cxx11::string::~string((string *)&t_5);
  tinyusdz::Xformable::~Xformable((Xformable *)&op_5._is_blocked);
  return;
}

Assistant:

void xformOp_test(void) {

  {
    value::double3 scale = {1.0, 2.0, 3.0};

    XformOp op;
    op.op_type = XformOp::OpType::Scale;
    op.inverted = true;
    op.set_value(scale);


    Xformable x;
    x.xformOps.push_back(op);

    value::matrix4d m;
    bool resetXformStack;
    std::string err;
    double t = value::TimeCode::Default();
    value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Held;

    bool ret = x.EvaluateXformOps(t, tinterp, &m, &resetXformStack, &err);
    TEST_CHECK(ret == true);

    TEST_CHECK(float_equals(m.m[0][0], 1.0));
    TEST_CHECK(float_equals(m.m[1][1], 1.0/2.0));
    TEST_CHECK(float_equals(m.m[2][2], 1.0/3.0));

  }

  {
    value::matrix4d a;
    a.m[0][0] = 0;
    a.m[0][1] = 0;
    a.m[0][2] = 1;
    a.m[0][3] = 0;
    a.m[1][0] = 0;
    a.m[1][1] = 1;
    a.m[1][2] = 0;
    a.m[1][3] = 0;

    a.m[2][0] = -1;
    a.m[2][1] = 0;
    a.m[2][2] = 0;
    a.m[2][3] = 0;
    a.m[3][0] = 0.44200000166893005;
    a.m[3][1] = -7.5320000648498535;
    a.m[3][2] = 18.611000061035156;
    a.m[3][3] = 1;

    value::matrix4d b = value::matrix4d::identity();
    b.m[3][2] = -30.0;

    value::matrix4d c = a * b;
    std::cout << c << "\n";

    // expected: (0, 0, 1, 0), (0, 1, 0, 0), (-1, 0, 0, 0), (0.442, -7.532, -11.389, 1)
    TEST_CHECK(float_equals(c.m[0][0], 0.0));
    TEST_CHECK(float_equals(c.m[0][1], 0.0));
    TEST_CHECK(float_equals(c.m[0][2], 1.0));
    TEST_CHECK(float_equals(c.m[0][3], 0.0));

    TEST_CHECK(float_equals(c.m[1][0], 0.0));
    TEST_CHECK(float_equals(c.m[1][1], 1.0));
    TEST_CHECK(float_equals(c.m[1][2], 0.0));
    TEST_CHECK(float_equals(c.m[1][3], 0.0));

    TEST_CHECK(float_equals(c.m[2][0], -1.0));
    TEST_CHECK(float_equals(c.m[2][1], 0.0));
    TEST_CHECK(float_equals(c.m[2][2], 0.0));
    TEST_CHECK(float_equals(c.m[2][3], 0.0));

    TEST_CHECK(float_equals(c.m[3][0], 0.442, 0.00001));
    TEST_CHECK(float_equals(c.m[3][1], -7.532, 0.00001));
    TEST_CHECK(float_equals(c.m[3][2], -11.389, 0.00001));
    TEST_CHECK(float_equals(c.m[3][3], 1.0));


  }

  // RotateXYZ 000
  {
    value::double3 rotXYZ = {90.0, 0.0, 0.0};

    XformOp op;
    op.op_type = XformOp::OpType::RotateXYZ;
    op.inverted = false;
    op.set_value(rotXYZ);

    Xformable x;
    x.xformOps.push_back(op);

    value::matrix4d m;
    bool resetXformStack;
    std::string err;
    double t = value::TimeCode::Default();
    value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Held;

    bool ret = x.EvaluateXformOps(t, tinterp, &m, &resetXformStack, &err);

    TEST_CHECK(ret);
    
    std::cout << "rotXYZ = " << m << "\n";

    //double eps = std::numeric_limits<double>::epsilon();

    // NOTE: in pxrUSD ret = ( (1, 0, 0, 0), (0, 6.12323e-17, 1, 0), (0, -1, 6.12323e-17, 0), (0, 0, 0, 1) )
    TEST_CHECK(float_equals(m.m[0][0], 1.0));
    TEST_CHECK(float_equals(m.m[0][1], 0.0));
    TEST_CHECK(float_equals(m.m[0][2], 0.0));
    TEST_CHECK(float_equals(m.m[0][3], 0.0));

    TEST_CHECK(float_equals(m.m[1][0], 0.0));
    TEST_CHECK(float_equals(m.m[1][1], 0.0));
    TEST_CHECK(float_equals(m.m[1][2], 1.0));
    TEST_CHECK(float_equals(m.m[1][3], 0.0));

    TEST_CHECK(float_equals(m.m[2][0], 0.0));
    TEST_CHECK(float_equals(m.m[2][1], -1.0));
    TEST_CHECK(float_equals(m.m[2][2], 0.0));
    TEST_CHECK(float_equals(m.m[2][3], 0.0));

    TEST_CHECK(float_equals(m.m[3][0], 0.0));
    TEST_CHECK(float_equals(m.m[3][1], 0.0));
    TEST_CHECK(float_equals(m.m[3][2], 0.0));
    TEST_CHECK(float_equals(m.m[3][3], 1.0));



  }

  // RotateXYZ 001
  {
    value::double3 rotXYZ = {0.0, 0.0, -65.66769};

    XformOp op;
    op.op_type = XformOp::OpType::RotateXYZ;
    op.inverted = false;
    op.set_value(rotXYZ);

    Xformable x;
    x.xformOps.push_back(op);

    value::matrix4d m;
    bool resetXformStack;
    std::string err;
    double t = value::TimeCode::Default();
    value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Held;

    bool ret = x.EvaluateXformOps(t, tinterp, &m, &resetXformStack, &err);

    TEST_CHECK(ret);
    
    std::cout << "rotXYZ = " << m << "\n";

    // 0.4120283041870241, -0.9111710468121587, 0, 0
    // 0.9111710468121587, 0.4120283041870241, 0, 0
    // 0, 0, 1, 0
    // 0, 0, 0, 1
    TEST_CHECK(float_equals(m.m[0][0], 0.4120283041870241, 0.00001));
    TEST_CHECK(float_equals(m.m[0][1], -0.9111710468121587, 0.00001));
    TEST_CHECK(float_equals(m.m[0][2], 0.0));
    TEST_CHECK(float_equals(m.m[0][3], 0.0));

    TEST_CHECK(float_equals(m.m[1][0], 0.9111710468121587, 0.00001));
    TEST_CHECK(float_equals(m.m[1][1], 0.4120283041870241, 0.00001));
    TEST_CHECK(float_equals(m.m[1][2], 0.0));
    TEST_CHECK(float_equals(m.m[1][3], 0.0));

    TEST_CHECK(float_equals(m.m[2][0], 0.0));
    TEST_CHECK(float_equals(m.m[2][1], 0.0));
    TEST_CHECK(float_equals(m.m[2][2], 1.0));
    TEST_CHECK(float_equals(m.m[2][3], 0.0));

    TEST_CHECK(float_equals(m.m[3][0], 0.0));
    TEST_CHECK(float_equals(m.m[3][1], 0.0));
    TEST_CHECK(float_equals(m.m[3][2], 0.0));
    TEST_CHECK(float_equals(m.m[3][3], 1.0));
  }

  // RotateXYZ 002
  {
    value::double3 rotXYZ = {10.0, 23.0, 43.2};

    XformOp op;
    op.op_type = XformOp::OpType::RotateXYZ;
    op.inverted = false;
    op.set_value(rotXYZ);

    Xformable x;
    x.xformOps.push_back(op);

    value::matrix4d m;
    bool resetXformStack;
    std::string err;
    double t = value::TimeCode::Default();
    value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Held;

    bool ret = x.EvaluateXformOps(t, tinterp, &m, &resetXformStack, &err);

    TEST_CHECK(ret);
    
    std::cout << "rotXYZ = " << m << "\n";

    double eps = std::numeric_limits<double>::epsilon();

    // numeric value is grabbed from pxrUSD.
    // There are slight eps error for [0][1], [1][0] and [1][1], so twice eps
    TEST_CHECK(float_equals(m.m[0][0], 0.6710191595559729, eps));
    TEST_CHECK(float_equals(m.m[0][1], 0.6301289334241799, eps));
    TEST_CHECK(float_equals(m.m[0][2], -0.39073112848927377, eps));
    TEST_CHECK(float_equals(m.m[0][3], 0.0));

    TEST_CHECK(float_equals(m.m[1][0], -0.6246869592440953, eps));
    TEST_CHECK(float_equals(m.m[1][1], 0.7643403049061097, eps));
    TEST_CHECK(float_equals(m.m[1][2], 0.15984399033558103, eps));
    TEST_CHECK(float_equals(m.m[1][3], 0.0));

    TEST_CHECK(float_equals(m.m[2][0], 0.3993738730302244, eps));
    TEST_CHECK(float_equals(m.m[2][1], 0.13682626048292368, eps));
    TEST_CHECK(float_equals(m.m[2][2], 0.9065203163653295, eps));
    TEST_CHECK(float_equals(m.m[2][3], 0.0));

    TEST_CHECK(float_equals(m.m[3][0], 0.0));
    TEST_CHECK(float_equals(m.m[3][1], 0.0));
    TEST_CHECK(float_equals(m.m[3][2], 0.0));
    TEST_CHECK(float_equals(m.m[3][3], 1.0));
  }

  // Rotate 003
  {
    value::double3 rotXYZ = {-10.0, 13.0, 43.2};

    XformOp op;
    op.op_type = XformOp::OpType::RotateXYZ;
    op.inverted = true;
    op.set_value(rotXYZ);

    Xformable x;
    x.xformOps.push_back(op);

    value::matrix4d m;
    bool resetXformStack;
    std::string err;
    double t = value::TimeCode::Default();
    value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Held;

    bool ret = x.EvaluateXformOps(t, tinterp, &m, &resetXformStack, &err);

    TEST_CHECK(ret);
    
    std::cout << "rotXYZ = " << m << "\n";

    double eps = std::numeric_limits<double>::epsilon();

  
    TEST_CHECK(float_equals(m.m[0][0], 0.7102852087270047, eps));
    TEST_CHECK(float_equals(m.m[0][1], -0.7026225180689177, eps));
    TEST_CHECK(float_equals(m.m[0][2], 0.0426206448347375, eps));
    TEST_CHECK(float_equals(m.m[0][3], 0.0));

    TEST_CHECK(float_equals(m.m[1][0], 0.6670022079522818, eps));
    TEST_CHECK(float_equals(m.m[1][1], 0.6911539437437854, eps));
    TEST_CHECK(float_equals(m.m[1][2], 0.2782342190209419, eps));
    TEST_CHECK(float_equals(m.m[1][3], 0.0));

    TEST_CHECK(float_equals(m.m[2][0], -0.224951054343865, eps));
    TEST_CHECK(float_equals(m.m[2][1], -0.16919758612316493, eps));
    TEST_CHECK(float_equals(m.m[2][2], 0.9595671941035071, eps));
    TEST_CHECK(float_equals(m.m[2][3], 0.0));

    TEST_CHECK(float_equals(m.m[3][0], 0.0));
    TEST_CHECK(float_equals(m.m[3][1], 0.0));
    TEST_CHECK(float_equals(m.m[3][2], 0.0));
    TEST_CHECK(float_equals(m.m[3][3], 1.0));
  }

  // trans x scale
  // scale firstly applied, then translation.
  {
    value::double3 trans = {1.0, 1.0, 1.0};
    value::double3 scale = {1.5, 0.5, 2.5};

    Xformable x;
    {
      XformOp op;
      op.op_type = XformOp::OpType::Translate;
      op.inverted = false;
      op.set_value(trans);

      x.xformOps.push_back(op);
    }

    {
      XformOp op;
      op.op_type = XformOp::OpType::Scale;
      op.inverted = false;
      op.set_value(scale);

      x.xformOps.push_back(op);
    }

    value::matrix4d m;
    bool resetXformStack;
    std::string err;
    double t = value::TimeCode::Default();
    value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Held;

    bool ret = x.EvaluateXformOps(t, tinterp, &m, &resetXformStack, &err);

    TEST_CHECK(ret);
    
    std::cout << "trans x scale = " << m << "\n";

    // 1.5 0 0 0, 0 1.5 0 0, 0 0 1.5 0, 1 0 0 1
    TEST_CHECK(float_equals(m.m[0][0], 1.5));
    TEST_CHECK(float_equals(m.m[0][1], 0.0));
    TEST_CHECK(float_equals(m.m[0][2], 0.0));
    TEST_CHECK(float_equals(m.m[0][3], 0.0));

    TEST_CHECK(float_equals(m.m[1][0], 0.0));
    TEST_CHECK(float_equals(m.m[1][1], 0.5));
    TEST_CHECK(float_equals(m.m[1][2], 0.0));
    TEST_CHECK(float_equals(m.m[1][3], 0.0));

    TEST_CHECK(float_equals(m.m[2][0], 0.0));
    TEST_CHECK(float_equals(m.m[2][1], 0.0));
    TEST_CHECK(float_equals(m.m[2][2], 2.5));
    TEST_CHECK(float_equals(m.m[2][3], 0.0));

    TEST_CHECK(float_equals(m.m[3][0], 1.0));
    TEST_CHECK(float_equals(m.m[3][1], 1.0));
    TEST_CHECK(float_equals(m.m[3][2], 1.0));
    TEST_CHECK(float_equals(m.m[3][3], 1.0));

  }


}